

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O0

void __thiscall Kernel::Problem::refreshProperty(Problem *this)

{
  Property *pPVar1;
  SMTLIBLogic smtLibLogic;
  Property *pPVar2;
  Problem *in_RDI;
  Problem *unaff_retaddr;
  Property *oldProp;
  ScopedLet<Shell::ExecutionPhase> phaseLet;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  UnitList *in_stack_ffffffffffffffd0;
  ScopedLet<Shell::ExecutionPhase> local_18;
  
  Lib::ScopedLet<Shell::ExecutionPhase>::ScopedLet
            (&local_18,(ExecutionPhase *)(DAT_01333840 + 600),PROPERTY_SCANNING);
  pPVar1 = in_RDI->_property;
  in_RDI->_propertyValid = true;
  pPVar2 = Shell::Property::scan(in_stack_ffffffffffffffd0);
  in_RDI->_property = pPVar2;
  if ((pPVar1 != (Property *)0x0) && (pPVar1 != (Property *)0x0)) {
    Shell::Property::~Property
              ((Property *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    ::operator_delete(pPVar1,0x118);
  }
  pPVar1 = in_RDI->_property;
  smtLibLogic = getSMTLIBLogic(in_RDI);
  Shell::Property::setSMTLIBLogic(pPVar1,smtLibLogic);
  readDetailsFromProperty(unaff_retaddr);
  Lib::ScopedLet<Shell::ExecutionPhase>::~ScopedLet(&local_18);
  return;
}

Assistant:

void Problem::refreshProperty() const
{
  TIME_TRACE(TimeTrace::PROPERTY_EVALUATION);
  ScopedLet<ExecutionPhase> phaseLet(env.statistics->phase, ExecutionPhase::PROPERTY_SCANNING);

  auto oldProp = _property;
  _propertyValid = true;
  _property = Property::scan(_units);
  if(oldProp) {
    delete oldProp;
  }
  ASS(_property);
  _property->setSMTLIBLogic(getSMTLIBLogic());
  readDetailsFromProperty();
}